

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

bool poll_stall_information(StallState *state)

{
  bool bVar1;
  int iVar2;
  undefined1 local_28 [8];
  timespec ts;
  StallState *state_local;
  
  ts.tv_nsec = (__syscall_slong_t)state;
  bVar1 = get_dirty_page_info(state);
  if (!bVar1) {
    *(undefined4 *)ts.tv_nsec = 0xffffffff;
  }
  bVar1 = get_stall_info("/proc/pressure/io",(int64_t *)(ts.tv_nsec + 8));
  if (!bVar1) {
    *(undefined8 *)(ts.tv_nsec + 8) = 0xffffffffffffffff;
  }
  memset(local_28,0,0x10);
  iVar2 = clock_gettime(1,(timespec *)local_28);
  if (iVar2 == 0) {
    *(long *)(ts.tv_nsec + 0x10) = (long)local_28 * 1000000000 + ts.tv_sec;
  }
  return iVar2 == 0;
}

Assistant:

static bool poll_stall_information(StallState &state)
{
	if (!get_dirty_page_info(state))
		state.dirty_pages_mib = -1;
	if (!get_stall_info("/proc/pressure/io", state.io_stalled_us))
		state.io_stalled_us = -1;

	timespec ts = {};
	if (clock_gettime(CLOCK_MONOTONIC, &ts) != 0)
		return false;
	state.timestamp_ns = ts.tv_sec * 1000000000ll + ts.tv_nsec;
	return true;
}